

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExtendsClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExtendsClauseSyntax,slang::parsing::Token,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*,slang::syntax::DefaultExtendsClauseArgSyntax*>
          (BumpAllocator *this,Token *args,NameSyntax *args_1,ArgumentListSyntax **args_2,
          DefaultExtendsClauseArgSyntax **args_3)

{
  ArgumentListSyntax *pAVar1;
  DefaultExtendsClauseArgSyntax *pDVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  ExtendsClauseSyntax *pEVar8;
  
  pEVar8 = (ExtendsClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExtendsClauseSyntax *)this->endPtr < pEVar8 + 1) {
    pEVar8 = (ExtendsClauseSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pEVar8 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar3 = args->info;
  pAVar1 = *args_2;
  pDVar2 = *args_3;
  (pEVar8->super_SyntaxNode).kind = ExtendsClause;
  (pEVar8->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pEVar8->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pEVar8->keyword).kind = TVar4;
  (pEVar8->keyword).field_0x2 = uVar5;
  (pEVar8->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pEVar8->keyword).rawLen = uVar7;
  (pEVar8->keyword).info = pIVar3;
  (pEVar8->baseName).ptr = args_1;
  pEVar8->arguments = pAVar1;
  pEVar8->defaultedArg = pDVar2;
  (args_1->super_ExpressionSyntax).super_SyntaxNode.parent = &pEVar8->super_SyntaxNode;
  if (pAVar1 != (ArgumentListSyntax *)0x0) {
    (pAVar1->super_SyntaxNode).parent = &pEVar8->super_SyntaxNode;
  }
  if (pDVar2 != (DefaultExtendsClauseArgSyntax *)0x0) {
    (pDVar2->super_SyntaxNode).parent = &pEVar8->super_SyntaxNode;
  }
  return pEVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }